

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_initialize(REF_CELL ref_cell,REF_CELL_TYPE type)

{
  int iVar1;
  REF_CELL_TYPE RVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  REF_CELL_TYPE RVar5;
  REF_CELL_TYPE RVar6;
  ulong uVar7;
  size_t sStack_20;
  
  ref_cell->type = type;
  ref_cell->last_node_is_an_id = 0;
  if (REF_CELL_HE2 < type) {
    return 6;
  }
  uVar7 = (ulong)type;
  RVar2 = *(REF_CELL_TYPE *)(&DAT_00207d70 + uVar7 * 4);
  ref_cell->last_node_is_an_id = RVar2;
  RVar5 = REF_CELL_TR2;
  RVar6 = RVar5;
  switch(uVar7) {
  case 0:
    RVar5 = REF_CELL_ED3;
    break;
  case 1:
    RVar5 = REF_CELL_TRI;
    break;
  case 3:
    goto switchD_001135c5_caseD_3;
  case 4:
    type = REF_CELL_QUA;
    goto switchD_001135c5_caseD_3;
  case 5:
    type = REF_CELL_PRI;
switchD_001135c5_caseD_3:
    RVar5 = REF_CELL_TRI;
    ref_cell->node_per = type;
    sStack_20 = 0x18;
LAB_00113628:
    RVar2 = RVar2 + type;
    goto LAB_00113648;
  case 6:
    goto switchD_001135c5_caseD_6;
  case 7:
    RVar6 = REF_CELL_PYR;
switchD_001135c5_caseD_6:
    ref_cell->node_per = RVar6;
    sStack_20 = 0x20;
    type = RVar6;
    goto LAB_00113628;
  case 8:
    goto switchD_001135c5_caseD_8;
  case 9:
    iVar1 = 5;
    goto LAB_0011362d;
  case 10:
    RVar5 = REF_CELL_QUA;
    goto LAB_0011363c;
  case 0xb:
    iVar1 = 8;
    goto LAB_00113602;
  case 0xc:
    RVar5 = REF_CELL_PRI;
switchD_001135c5_caseD_8:
    ref_cell->node_per = RVar5;
    RVar2 = RVar2 | RVar5;
    sStack_20 = 0x30;
    RVar5 = REF_CELL_QUA;
    goto LAB_00113648;
  case 0xd:
    iVar1 = 0xe;
LAB_0011362d:
    sStack_20 = 0x40;
    ref_cell->node_per = iVar1;
    RVar2 = RVar2 + iVar1;
    RVar5 = REF_CELL_TET;
    goto LAB_00113648;
  case 0xe:
    RVar5 = 0x12;
LAB_0011363c:
    ref_cell->node_per = RVar5;
    RVar2 = RVar2 | RVar5;
    sStack_20 = 0x48;
    RVar5 = REF_CELL_PYR;
    goto LAB_00113648;
  case 0xf:
    iVar1 = 0x1b;
LAB_00113602:
    sStack_20 = 0x60;
    ref_cell->node_per = iVar1;
    RVar2 = RVar2 + iVar1;
    RVar5 = REF_CELL_TE2;
    goto LAB_00113648;
  }
  ref_cell->node_per = RVar5;
  RVar2 = RVar2 + RVar5;
  sStack_20 = 8;
  RVar5 = REF_CELL_ED2;
LAB_00113648:
  ref_cell->size_per = RVar2;
  ref_cell->edge_per = RVar5;
  pRVar4 = (REF_INT *)malloc(sStack_20);
  ref_cell->e2n = pRVar4;
  if (pRVar4 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x99,
           "ref_cell_initialize","malloc ref_cell->e2n of REF_INT NULL");
    return 2;
  }
  RVar3 = (*(code *)(&DAT_00207c70 + *(int *)(&DAT_00207c70 + uVar7 * 4)))();
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_cell_initialize(REF_CELL ref_cell,
                                              REF_CELL_TYPE type) {
  ref_cell_type(ref_cell) = type;

  ref_cell_last_node_is_an_id(ref_cell) = REF_FALSE;
  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_last_node_is_an_id(ref_cell) = REF_TRUE;
      break;
    case REF_CELL_TET:
    case REF_CELL_PYR:
    case REF_CELL_PRI:
    case REF_CELL_HEX:
    case REF_CELL_TE2:
    case REF_CELL_PY2:
    case REF_CELL_PR2:
    case REF_CELL_HE2:
      ref_cell_last_node_is_an_id(ref_cell) = REF_FALSE;
      break;
    default:
      return REF_IMPLEMENT;
  }

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
      ref_cell_node_per(ref_cell) = 2;
      break;
    case REF_CELL_ED2:
      ref_cell_node_per(ref_cell) = 3;
      break;
    case REF_CELL_ED3:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_TRI:
      ref_cell_node_per(ref_cell) = 3;
      break;
    case REF_CELL_TR2:
      ref_cell_node_per(ref_cell) = 6;
      break;
    case REF_CELL_TR3:
      ref_cell_node_per(ref_cell) = 10;
      break;
    case REF_CELL_QUA:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_QU2:
      ref_cell_node_per(ref_cell) = 9;
      break;
    case REF_CELL_TET:
      ref_cell_node_per(ref_cell) = 4;
      break;
    case REF_CELL_PYR:
      ref_cell_node_per(ref_cell) = 5;
      break;
    case REF_CELL_PRI:
      ref_cell_node_per(ref_cell) = 6;
      break;
    case REF_CELL_HEX:
      ref_cell_node_per(ref_cell) = 8;
      break;
    case REF_CELL_TE2:
      ref_cell_node_per(ref_cell) = 10;
      break;
    case REF_CELL_PY2:
      ref_cell_node_per(ref_cell) = 14;
      break;
    case REF_CELL_PR2:
      ref_cell_node_per(ref_cell) = 18;
      break;
    case REF_CELL_HE2:
      ref_cell_node_per(ref_cell) = 27;
      break;
    default:
      return REF_IMPLEMENT;
  }

  ref_cell_size_per(ref_cell) = ref_cell_node_per(ref_cell) +
                                (ref_cell_last_node_is_an_id(ref_cell) ? 1 : 0);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_edge_per(ref_cell) = 1;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_edge_per(ref_cell) = 3;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_edge_per(ref_cell) = 4;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_edge_per(ref_cell) = 6;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_edge_per(ref_cell) = 8;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_edge_per(ref_cell) = 9;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_edge_per(ref_cell) = 12;
      break;
    default:
      ref_cell_edge_per(ref_cell) = 0;
      break;
  }

  ref_cell->e2n = NULL;
  if (ref_cell_edge_per(ref_cell) > 0)
    ref_malloc(ref_cell->e2n, 2 * ref_cell_edge_per(ref_cell), REF_INT);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 0;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 0;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 4;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 8) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 8) = 5;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_e2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_e2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 1) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_e2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_e2n_gen(ref_cell, 0, 3) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_e2n_gen(ref_cell, 0, 4) = 1;
      ref_cell_e2n_gen(ref_cell, 1, 4) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 5) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 5) = 3;
      ref_cell_e2n_gen(ref_cell, 0, 6) = 2;
      ref_cell_e2n_gen(ref_cell, 1, 6) = 6;
      ref_cell_e2n_gen(ref_cell, 0, 7) = 3;
      ref_cell_e2n_gen(ref_cell, 1, 7) = 7;
      ref_cell_e2n_gen(ref_cell, 0, 8) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 8) = 5;
      ref_cell_e2n_gen(ref_cell, 0, 9) = 4;
      ref_cell_e2n_gen(ref_cell, 1, 9) = 7;
      ref_cell_e2n_gen(ref_cell, 0, 10) = 5;
      ref_cell_e2n_gen(ref_cell, 1, 10) = 6;
      ref_cell_e2n_gen(ref_cell, 0, 11) = 6;
      ref_cell_e2n_gen(ref_cell, 1, 11) = 7;
      break;
    default:
      return REF_IMPLEMENT;
  }

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      ref_cell_face_per(ref_cell) = 0;
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_face_per(ref_cell) = 1;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_face_per(ref_cell) = 1;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_face_per(ref_cell) = 4;
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_face_per(ref_cell) = 5;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_face_per(ref_cell) = 5;
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_face_per(ref_cell) = 6;
      break;
    default:
      return REF_IMPLEMENT;
  }

  ref_cell->f2n = NULL;
  if (ref_cell_face_per(ref_cell) > 0)
    ref_malloc(ref_cell->f2n, 4 * ref_cell_face_per(ref_cell), REF_INT);

  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
    case REF_CELL_ED2:
    case REF_CELL_ED3:
      break;
    case REF_CELL_TRI:
    case REF_CELL_TR2:
    case REF_CELL_TR3:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 0;
      break;
    case REF_CELL_QUA:
    case REF_CELL_QU2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 3;
      break;
    case REF_CELL_TET:
    case REF_CELL_TE2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = ref_cell_f2n_gen(ref_cell, 0, 0);
      ref_cell_f2n_gen(ref_cell, 0, 1) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 1) = ref_cell_f2n_gen(ref_cell, 0, 1);
      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 1;
      ref_cell_f2n_gen(ref_cell, 3, 2) = ref_cell_f2n_gen(ref_cell, 0, 2);
      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);
      break;
    case REF_CELL_PYR:
    case REF_CELL_PY2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 0) = ref_cell_f2n_gen(ref_cell, 0, 0);
      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 1) = ref_cell_f2n_gen(ref_cell, 0, 1);
      ref_cell_f2n_gen(ref_cell, 0, 2) = 2;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 2) = ref_cell_f2n_gen(ref_cell, 0, 2);
      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 3;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);
      ref_cell_f2n_gen(ref_cell, 0, 4) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 4) = 1;
      break;
    case REF_CELL_PRI:
    case REF_CELL_PR2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 1;

      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 1) = 2;

      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 2;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 2) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 3) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 3) = ref_cell_f2n_gen(ref_cell, 0, 3);

      ref_cell_f2n_gen(ref_cell, 0, 4) = 3;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 5;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 4;
      ref_cell_f2n_gen(ref_cell, 3, 4) = ref_cell_f2n_gen(ref_cell, 0, 4);
      break;
    case REF_CELL_HEX:
    case REF_CELL_HE2:
      ref_cell_f2n_gen(ref_cell, 0, 0) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 0) = 3;
      ref_cell_f2n_gen(ref_cell, 2, 0) = 7;
      ref_cell_f2n_gen(ref_cell, 3, 0) = 4;

      ref_cell_f2n_gen(ref_cell, 0, 1) = 1;
      ref_cell_f2n_gen(ref_cell, 1, 1) = 5;
      ref_cell_f2n_gen(ref_cell, 2, 1) = 6;
      ref_cell_f2n_gen(ref_cell, 3, 1) = 2;

      ref_cell_f2n_gen(ref_cell, 0, 2) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 2) = 4;
      ref_cell_f2n_gen(ref_cell, 2, 2) = 5;
      ref_cell_f2n_gen(ref_cell, 3, 2) = 1;

      ref_cell_f2n_gen(ref_cell, 0, 3) = 2;
      ref_cell_f2n_gen(ref_cell, 1, 3) = 6;
      ref_cell_f2n_gen(ref_cell, 2, 3) = 7;
      ref_cell_f2n_gen(ref_cell, 3, 3) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 4) = 0;
      ref_cell_f2n_gen(ref_cell, 1, 4) = 1;
      ref_cell_f2n_gen(ref_cell, 2, 4) = 2;
      ref_cell_f2n_gen(ref_cell, 3, 4) = 3;

      ref_cell_f2n_gen(ref_cell, 0, 5) = 4;
      ref_cell_f2n_gen(ref_cell, 1, 5) = 7;
      ref_cell_f2n_gen(ref_cell, 2, 5) = 6;
      ref_cell_f2n_gen(ref_cell, 3, 5) = 5;
      break;
    default:
      return REF_IMPLEMENT;
  }

  return REF_SUCCESS;
}